

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O0

void __thiscall FastPForLib::BitWidthHistoGram::display(BitWidthHistoGram *this,string *prefix)

{
  size_type sVar1;
  reference pvVar2;
  undefined8 uVar3;
  vector<double,_std::allocator<double>_> *in_RDI;
  size_t k_1;
  size_t k;
  double sum;
  ulong local_28;
  ulong local_20;
  double local_18;
  
  local_18 = 0.0;
  for (local_20 = 0; sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI),
      local_20 < sVar1; local_20 = local_20 + 1) {
    pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_20);
    local_18 = *pvVar2 + local_18;
  }
  if ((local_18 != 0.0) || (NAN(local_18))) {
    for (local_28 = 0; sVar1 = std::vector<double,_std::allocator<double>_>::size(in_RDI),
        local_28 < sVar1; local_28 = local_28 + 1) {
      uVar3 = std::__cxx11::string::c_str();
      pvVar2 = std::vector<double,_std::allocator<double>_>::operator[](in_RDI,local_28);
      printf("%s%zu %f\n",*pvVar2 / local_18,uVar3,local_28);
    }
  }
  return;
}

Assistant:

void display(std::string prefix = "") {
    double sum = 0;
    for (size_t k = 0; k < histo.size(); ++k)
      sum += histo[k];
    if (sum == 0)
      return;
    for (size_t k = 0; k < histo.size(); ++k) {
      printf("%s%zu %f\n", prefix.c_str(), k, histo[k] / sum);
    }
  }